

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall embree::TokenStream::decDigits(TokenStream *this,string *str_o)

{
  int *piVar1;
  bool bVar2;
  string str;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  piVar1 = Stream<int>::peek((this->cin).ptr);
  if (*piVar1 != 0x2b) {
    piVar1 = Stream<int>::peek((this->cin).ptr);
    if (*piVar1 != 0x2d) goto LAB_001d8c3e;
  }
  Stream<int>::get((this->cin).ptr);
  std::__cxx11::string::push_back((char)&local_48);
LAB_001d8c3e:
  bVar2 = false;
  while( true ) {
    piVar1 = Stream<int>::peek((this->cin).ptr);
    if (9 < *piVar1 - 0x30U) break;
    Stream<int>::get((this->cin).ptr);
    bVar2 = true;
    std::__cxx11::string::push_back((char)&local_48);
  }
  if (bVar2) {
    std::__cxx11::string::_M_append((char *)str_o,(ulong)local_48);
  }
  else {
    Stream<int>::unget((this->cin).ptr,local_40);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return bVar2;
}

Assistant:

bool TokenStream::decDigits(std::string& str_o)
  {
    bool ok = false;
    std::string str;
    if (cin->peek() == '+' || cin->peek() == '-') str += (char)cin->get();
    while (isDigit(cin->peek())) { ok = true; str += (char)cin->get(); }
    if (ok) str_o += str;
    else cin->unget(str.size());
    return ok;
  }